

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::EnumDescriptorProto_EnumReservedRange::_InternalSerialize
          (EnumDescriptorProto_EnumReservedRange *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    puVar4 = target;
    if (stream->end_ <= target) {
      puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar2 = this->start_;
    *puVar4 = '\b';
    puVar4[1] = (byte)uVar2;
    if ((ulong)(long)(int)uVar2 < 0x80) {
      target = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar2 | 0x80;
      uVar6 = (ulong)(long)(int)uVar2 >> 7;
      puVar4[2] = (uint8_t)uVar6;
      target = puVar4 + 3;
      if (0x3fff < uVar2) {
        uVar7 = (ulong)puVar4[2];
        do {
          target[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *target = (uint8_t)uVar5;
          target = target + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar3 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar3);
      }
    }
  }
  puVar4 = target;
  if ((uVar1 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar1 = this->end_;
    *target = '\x10';
    target[1] = (byte)uVar1;
    if ((ulong)(long)(int)uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      target[1] = (byte)uVar1 | 0x80;
      uVar6 = (ulong)(long)(int)uVar1 >> 7;
      target[2] = (uint8_t)uVar6;
      puVar4 = target + 3;
      if (0x3fff < uVar1) {
        uVar7 = (ulong)target[2];
        do {
          puVar4[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar3 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar3);
      }
    }
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffc) + 8),puVar4,stream);
    return puVar4;
  }
  return puVar4;
}

Assistant:

uint8_t* EnumDescriptorProto_EnumReservedRange::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto.EnumReservedRange)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 start = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_start(), target);
  }

  // optional int32 end = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto.EnumReservedRange)
  return target;
}